

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntAllocArray(int *pArray,int nSize)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *p;
  int nSize_local;
  int *pArray_local;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  pVVar1->nSize = nSize;
  pVVar1->nCap = nSize;
  pVVar1->pArray = pArray;
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntAllocArray( int * pArray, int nSize )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    p->nSize  = nSize;
    p->nCap   = nSize;
    p->pArray = pArray;
    return p;
}